

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O0

bool __thiscall
EnvironmentNAVXYTHETALATTICE::InitializeEnv(EnvironmentNAVXYTHETALATTICE *this,char *sEnvFile)

{
  FILE *__stream;
  string *what_arg;
  char *in_RSI;
  long *in_RDI;
  FILE *fCfg;
  SBPL_Exception *this_00;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  __stream = fopen(in_RSI,"r");
  if (__stream == (FILE *)0x0) {
    what_arg = (string *)__cxa_allocate_exception(0x10);
    this_00 = (SBPL_Exception *)&stack0xffffffffffffffc7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    SBPL_Exception::SBPL_Exception(this_00,what_arg);
    __cxa_throw(what_arg,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  (**(code **)(*in_RDI + 0x1b8))(in_RDI,__stream);
  fclose(__stream);
  (**(code **)(*in_RDI + 0x1d8))(in_RDI,0);
  return true;
}

Assistant:

bool EnvironmentNAVXYTHETALATTICE::InitializeEnv(const char* sEnvFile)
{
    FILE* fCfg = fopen(sEnvFile, "r");
    if (fCfg == NULL) {
        SBPL_ERROR("ERROR: unable to open %s\n", sEnvFile);
        throw SBPL_Exception();
    }
    ReadConfiguration(fCfg);
    fclose(fCfg);

    InitGeneral( NULL);

    return true;
}